

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor.cpp
# Opt level: O1

void __thiscall
boost::iostreams::file_descriptor::file_descriptor
          (file_descriptor *this,handle_type fd,file_descriptor_flags f)

{
  file_descriptor_impl *p;
  
  p = (file_descriptor_impl *)operator_new(8);
  p->handle_ = -1;
  p->flags_ = 0;
  shared_ptr<boost::iostreams::detail::file_descriptor_impl>::
  shared_ptr<boost::iostreams::detail::file_descriptor_impl>(&this->pimpl_,p);
  open(this,(char *)(ulong)(uint)fd,f);
  return;
}

Assistant:

file_descriptor::file_descriptor(handle_type fd, file_descriptor_flags f)
    : pimpl_(new impl_type)
{ open(fd, f); }